

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O0

void __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::
PushModelTo<TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>>
          (FlatModel<mp::DefaultFlatModelParams> *this,
          TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
          *mapi)

{
  bool bVar1;
  FlatModelInfo *pFVar2;
  FlatModel<mp::DefaultFlatModelParams> *in_RSI;
  FlatModel<mp::DefaultFlatModelParams> *in_RDI;
  TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
  *in_stack_00000228;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_00000230;
  FlatModel<mp::DefaultFlatModelParams> *this_00;
  FlatModel<mp::DefaultFlatModelParams> *this_01;
  
  CreateFlatModelInfo(in_RSI,(BasicFlatModelAPI *)in_RDI);
  this_00 = in_RSI;
  pFVar2 = GetModelInfo((FlatModel<mp::DefaultFlatModelParams> *)0x433995);
  BasicFlatModelAPI::PassFlatModelInfo((BasicFlatModelAPI *)in_RSI,pFVar2);
  this_01 = this_00;
  pFVar2 = GetModelInfo((FlatModel<mp::DefaultFlatModelParams> *)0x4339b5);
  BasicFlatModelAPI::InitProblemModificationPhase((BasicFlatModelAPI *)this_00,pFVar2);
  PushVariablesTo<TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>>
            (in_stack_00000230,in_stack_00000228);
  PushCustomConstraintsTo<TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>>
            (this_01,(TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
                      *)in_RDI);
  bVar1 = if_skip_pushing_objs(in_RDI);
  if (!bVar1) {
    PushObjectivesTo<TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>>
              (this_01,(TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
                        *)in_RDI);
  }
  BasicFlatModelAPI::FinishProblemModificationPhase((BasicFlatModelAPI *)this_01);
  return;
}

Assistant:

void PushModelTo(ModelAPI& mapi) const {
    CreateFlatModelInfo(mapi);
    mapi.PassFlatModelInfo(GetModelInfo());

    mapi.InitProblemModificationPhase(GetModelInfo());
    PushVariablesTo(mapi);
    PushCustomConstraintsTo(mapi);
    if (!if_skip_pushing_objs())
      PushObjectivesTo(mapi);
    mapi.FinishProblemModificationPhase();
  }